

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

parser_error parse_object_property_code(parser *p)

{
  void *pvVar1;
  char *code_00;
  int local_2c;
  wchar_t index;
  char *code;
  obj_property *prop;
  parser *p_local;
  
  pvVar1 = parser_priv(p);
  code_00 = parser_getstr(p,"code");
  local_2c = -1;
  if (pvVar1 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else if (*(int *)((long)pvVar1 + 8) == 0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_OBJ_PROP_TYPE;
  }
  else {
    if (*(int *)((long)pvVar1 + 8) == 1) {
      local_2c = code_index_in_array(obj_mods,code_00);
    }
    else if (*(int *)((long)pvVar1 + 8) == 2) {
      local_2c = code_index_in_array(obj_mods,code_00);
    }
    else if (*(int *)((long)pvVar1 + 8) == 3) {
      local_2c = code_index_in_array(obj_flags,code_00);
    }
    else if (*(int *)((long)pvVar1 + 8) == 5) {
      local_2c = code_index_in_array(element_names,code_00);
    }
    else if (*(int *)((long)pvVar1 + 8) == 4) {
      local_2c = code_index_in_array(element_names,code_00);
    }
    if (local_2c < 0) {
      p_local._4_4_ = PARSE_ERROR_INVALID_OBJ_PROP_CODE;
    }
    else {
      *(int *)((long)pvVar1 + 0x14) = local_2c;
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_object_property_code(struct parser *p) {
	struct obj_property *prop = parser_priv(p);
	const char *code = parser_getstr(p, "code");
	int index = -1;

	if (!prop) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	if (!prop->type) {
		return PARSE_ERROR_MISSING_OBJ_PROP_TYPE;
	}
	if (prop->type == OBJ_PROPERTY_STAT) {
		index = code_index_in_array(obj_mods, code);
	} else if (prop->type == OBJ_PROPERTY_MOD) {
		index = code_index_in_array(obj_mods, code);
	} else if (prop->type == OBJ_PROPERTY_FLAG) {
		index = code_index_in_array(obj_flags, code);
	} else if (prop->type == OBJ_PROPERTY_IGNORE) {
		index = code_index_in_array(element_names, code);
	} else if (prop->type == OBJ_PROPERTY_ELEMENT) {
		index = code_index_in_array(element_names, code);
	}
	if (index >= 0) {
		prop->index = index;
	} else {
		return PARSE_ERROR_INVALID_OBJ_PROP_CODE;
	}
	return PARSE_ERROR_NONE;
}